

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

bool __thiscall QMdiArea::eventFilter(QMdiArea *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  QMdiAreaPrivate *pQVar2;
  undefined8 uVar3;
  Data *pDVar4;
  QMdiAreaTabBar *pQVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  QMdiArea *pQVar10;
  QWidget *pQVar11;
  qsizetype qVar12;
  QObject *pQVar13;
  long in_FS_OFFSET;
  QMdiSubWindow *subWindow;
  undefined1 local_58 [24];
  QWidget *local_40;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
      goto LAB_0044bc3d;
    }
    goto LAB_0044bd83;
  }
  if ((*(ushort *)(event + 8) & 0xfffe) == 6) {
    uVar7 = QKeyEvent::modifiers();
    pQVar13 = object;
    if (((uVar7 >> 0x1a & 1) == 0) && (*(int *)(event + 0x40) != 0x1000021)) {
LAB_0044bc23:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0044bc3d:
        bVar6 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
        return bVar6;
      }
      goto LAB_0044bd83;
    }
    do {
      pQVar13 = *(QObject **)(*(long *)(pQVar13 + 8) + 0x10);
      if (pQVar13 == (QObject *)0x0) {
        lVar9 = 0;
        break;
      }
      lVar9 = QMetaObject::cast((QObject *)&staticMetaObject);
    } while (lVar9 == 0);
    if (lVar9 == 0) goto LAB_0044bc23;
    iVar8 = *(int *)(event + 0x40);
    if (1 < iVar8 + 0xfeffffffU) {
      if (iVar8 == 0x1000000) {
        lVar9 = *(long *)(lVar9 + 8);
        pQVar11 = *(QWidget **)(lVar9 + 0x318);
        if ((pQVar11 != (QWidget *)0x0) && ((pQVar11->data->widget_attributes & 0x8000) != 0)) {
          QWidget::hide(pQVar11);
        }
        *(undefined4 *)(lVar9 + 0x3d8) = 0xffffffff;
      }
      else if (iVar8 == 0x1000021) {
        pQVar2 = *(QMdiAreaPrivate **)(lVar9 + 8);
        if (*(short *)(event + 8) == 6) {
          uVar3 = *(undefined8 *)
                   &(pQVar2->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
          iVar8 = QApplication::keyboardInputInterval();
          QBasicTimer::start(&pQVar2->tabToPreviousTimer,(long)iVar8 * 1000000,1,uVar3);
        }
        else {
          QMdiAreaPrivate::activateHighlightedWindow(pQVar2);
        }
      }
      goto LAB_0044bc23;
    }
    bVar6 = true;
    if (*(short *)(event + 8) == 6) {
      QMdiAreaPrivate::highlightNextSubWindow
                (*(QMdiAreaPrivate **)(lVar9 + 8),(uint)(iVar8 == 0x1000001) * 2 + -1);
    }
  }
  else {
    pQVar2 = *(QMdiAreaPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    local_40 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if (local_40 == (QWidget *)0x0) {
      if ((*(short *)(event + 8) == 0x79) &&
         ((((pDVar4 = (pQVar2->active).wp.d, pDVar4 == (Data *)0x0 || (*(int *)(pDVar4 + 4) == 0))
           || ((pQVar2->active).wp.value == (QObject *)0x0)) &&
          ((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
           0x8000) != 0)))) {
        pQVar11 = QWidget::window((QWidget *)this);
        bVar6 = QWidget::isMinimized(pQVar11);
        if (!bVar6) {
          QMdiAreaPrivate::activateCurrentWindow(pQVar2);
          goto switchD_0044b9e9_caseD_f;
        }
      }
      if (((*(short *)(event + 8) == 0x7a) &&
          (pDVar4 = (pQVar2->active).wp.d, pDVar4 != (Data *)0x0)) &&
         ((*(int *)(pDVar4 + 4) != 0 && ((pQVar2->active).wp.value != (QObject *)0x0)))) {
        if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
          pQVar13 = (QObject *)0x0;
        }
        else {
          pQVar13 = (pQVar2->active).wp.value;
        }
        if (pQVar13 != (QObject *)0x0) {
          QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)(pQVar13 + 8),false,false);
        }
      }
      goto switchD_0044b9e9_caseD_f;
    }
    pQVar10 = QMdiSubWindow::mdiArea((QMdiSubWindow *)local_40);
    if (pQVar10 != this) goto switchD_0044b9e9_caseD_f;
    uVar1 = *(ushort *)(event + 8);
    if (0x20 < uVar1) {
      if (uVar1 == 0x21) {
LAB_0044bba3:
        pQVar5 = pQVar2->tabBar;
        if (pQVar5 != (QMdiAreaTabBar *)0x0) {
          qVar12 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                             (&pQVar2->childWindows,(QMdiSubWindow **)&local_40,0);
          tabTextFor((QString *)local_58,(QMdiSubWindow *)local_40);
          QTabBar::setTabText(&pQVar5->super_QTabBar,(int)qVar12,(QString *)local_58);
          if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_58._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
            }
          }
        }
      }
      else if (uVar1 == 0x22) {
        pQVar5 = pQVar2->tabBar;
        if (pQVar5 != (QMdiAreaTabBar *)0x0) {
          qVar12 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                             (&pQVar2->childWindows,(QMdiSubWindow **)&local_40,0);
          QWidget::windowIcon((QWidget *)local_58);
          QTabBar::setTabIcon(&pQVar5->super_QTabBar,(int)qVar12,(QIcon *)local_58);
          QIcon::~QIcon((QIcon *)local_58);
        }
      }
      else if (uVar1 == 0x66) goto LAB_0044bba3;
      goto switchD_0044b9e9_caseD_f;
    }
    switch(uVar1) {
    case 0xd:
    case 0xe:
      if (pQVar2->tileCalledFromResizeEvent != false) break;
      QMdiAreaPrivate::updateScrollBars(pQVar2);
      bVar6 = QWidget::isMinimized(local_40);
      if (bVar6) break;
      goto LAB_0044bcb5;
    case 0x11:
      if (pQVar2->tabBar != (QMdiAreaTabBar *)0x0) {
        qVar12 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                           (&pQVar2->childWindows,(QMdiSubWindow **)&local_40,0);
        bVar6 = QTabBar::isTabEnabled(&pQVar2->tabBar->super_QTabBar,(int)qVar12);
        if (!bVar6) {
          QTabBar::setTabEnabled(&pQVar2->tabBar->super_QTabBar,(int)qVar12,true);
        }
      }
    case 0x12:
      if (event[0xb] == (QEvent)0x0) {
LAB_0044bcb5:
        pQVar2->isSubWindowsTiled = false;
      }
      break;
    case 0x13:
      qVar12 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                         (&pQVar2->childWindows,(QMdiSubWindow **)&local_40,0);
      if (qVar12 == pQVar2->indexToHighlighted) {
        QMdiAreaPrivate::hideRubberBand(pQVar2);
      }
    }
switchD_0044b9e9_caseD_f:
    bVar6 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
LAB_0044bd83:
  __stack_chk_fail();
}

Assistant:

bool QMdiArea::eventFilter(QObject *object, QEvent *event)
{
    if (!object)
        return QAbstractScrollArea::eventFilter(object, event);

    Q_D(QMdiArea);
    // Global key events with Ctrl modifier.
    if (event->type() == QEvent::KeyPress || event->type() == QEvent::KeyRelease) {

        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        // Ignore key events without a Ctrl modifier (except for press/release on the modifier itself).
        if (!(keyEvent->modifiers() & Qt::ControlModifier) && keyEvent->key() != Qt::Key_Control)
            return QAbstractScrollArea::eventFilter(object, event);

        // Find closest mdi area (in case we have a nested workspace).
        QMdiArea *area = mdiAreaParent(static_cast<QWidget *>(object));
        if (!area)
            return QAbstractScrollArea::eventFilter(object, event);

        const bool keyPress = (event->type() == QEvent::KeyPress);

        // 1) Ctrl-Tab once -> activate the previously active window.
        // 2) Ctrl-Tab (Tab, Tab, ...) -> iterate through all windows (activateNextSubWindow()).
        // 3) Ctrl-Shift-Tab (Tab, Tab, ...) -> iterate through all windows in the opposite
        //    direction (activatePreviousSubWindow())
        switch (keyEvent->key()) {
        case Qt::Key_Control:
            if (keyPress)
                area->d_func()->startTabToPreviousTimer();
            else
                area->d_func()->activateHighlightedWindow();
            break;
        case Qt::Key_Tab:
        case Qt::Key_Backtab:
            if (keyPress)
                area->d_func()->highlightNextSubWindow(keyEvent->key() == Qt::Key_Tab ? 1 : -1);
            return true;
#if QT_CONFIG(rubberband)
        case Qt::Key_Escape:
            area->d_func()->hideRubberBand();
            break;
#endif
        default:
            break;
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    QMdiSubWindow *subWindow = qobject_cast<QMdiSubWindow *>(object);

    if (!subWindow) {
        // QApplication events:
        if (event->type() == QEvent::ApplicationActivate && !d->active
            && isVisible() && !window()->isMinimized()) {
            d->activateCurrentWindow();
        } else if (event->type() == QEvent::ApplicationDeactivate && d->active) {
            d->setActive(d->active, false, false);
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    if (subWindow->mdiArea() != this)
        return QAbstractScrollArea::eventFilter(object, event);

    // QMdiSubWindow events:
    switch (event->type()) {
    case QEvent::Move:
    case QEvent::Resize:
        if (d->tileCalledFromResizeEvent)
            break;
        d->updateScrollBars();
        if (!subWindow->isMinimized())
            d->isSubWindowsTiled = false;
        break;
    case QEvent::Show:
#if QT_CONFIG(tabbar)
        if (d->tabBar) {
            const int tabIndex = d->childWindows.indexOf(subWindow);
            if (!d->tabBar->isTabEnabled(tabIndex))
                d->tabBar->setTabEnabled(tabIndex, true);
        }
#endif // QT_CONFIG(tabbar)
        Q_FALLTHROUGH();
    case QEvent::Hide:
        // Do not reset the isSubWindowsTiled flag if the event is a spontaneous system window event.
        // This ensures that tiling will be performed during the resizeEvent after an application
        // window minimize (hide) and then restore (show).
        if (!event->spontaneous())
            d->isSubWindowsTiled = false;
        break;
#if QT_CONFIG(rubberband)
    case QEvent::Close:
        if (d->childWindows.indexOf(subWindow) == d->indexToHighlighted)
            d->hideRubberBand();
        break;
#endif
#if QT_CONFIG(tabbar)
    case QEvent::WindowTitleChange:
    case QEvent::ModifiedChange:
        if (d->tabBar)
            d->tabBar->setTabText(d->childWindows.indexOf(subWindow), tabTextFor(subWindow));
        break;
    case QEvent::WindowIconChange:
        if (d->tabBar)
            d->tabBar->setTabIcon(d->childWindows.indexOf(subWindow), subWindow->windowIcon());
        break;
#endif // QT_CONFIG(tabbar)
    default:
        break;
    }
    return QAbstractScrollArea::eventFilter(object, event);
}